

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

void __thiscall QHttpSocketEngine::emitWriteNotification(QHttpSocketEngine *this)

{
  QHttpSocketEnginePrivate *pQVar1;
  undefined8 in_RDI;
  ConnectionType c;
  char *unaff_retaddr;
  QHttpSocketEnginePrivate *d;
  
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  pQVar1 = d_func((QHttpSocketEngine *)0x33b59b);
  if (((pQVar1->writeNotificationEnabled & 1U) != 0) &&
     ((pQVar1->writeNotificationPending & 1U) == 0)) {
    pQVar1->writeNotificationPending = true;
    QMetaObject::invokeMethod<>((QObject *)d,unaff_retaddr,c);
  }
  return;
}

Assistant:

void QHttpSocketEngine::emitWriteNotification()
{
    Q_D(QHttpSocketEngine);
    if (d->writeNotificationEnabled && !d->writeNotificationPending) {
        d->writeNotificationPending = true;
        QMetaObject::invokeMethod(this, "emitPendingWriteNotification", Qt::QueuedConnection);
    }
}